

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void anon_unknown.dwarf_ae21a::traversePrePost
               (Ref node,function<void_(cashew::Ref)> *visitPre,
               function<void_(cashew::Ref)> *visitPost)

{
  Ref __args;
  bool bVar1;
  reference pvVar2;
  reference pRVar3;
  Ref node_1;
  Ref child;
  iterator __end3;
  iterator __begin3;
  vector<cashew::Ref,_std::allocator<cashew::Ref>_> *__range3;
  TraverseInfo *back;
  TraverseInfo local_60;
  undefined1 local_38 [8];
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  stack;
  function<void_(cashew::Ref)> *visitPost_local;
  function<void_(cashew::Ref)> *visitPre_local;
  Ref node_local;
  
  stack.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)visitPost;
  std::
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::vector((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
            *)local_38);
  TraverseInfo::TraverseInfo(&local_60,node);
  std::
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::push_back((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               *)local_38,&local_60);
  TraverseInfo::~TraverseInfo(&local_60);
  while (bVar1 = std::
                 vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 ::empty((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                          *)local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ::back((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                     *)local_38);
    if ((pvVar2->scanned & 1U) == 0) {
      pvVar2->scanned = true;
      std::function<void_(cashew::Ref)>::operator()(visitPre,(pvVar2->node).inst);
      __end3 = std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>::begin(&pvVar2->children);
      child.inst = (Value *)std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>::end
                                      (&pvVar2->children);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cashew::Ref_*,_std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>_>
                                         *)&child), bVar1) {
        pRVar3 = __gnu_cxx::
                 __normal_iterator<cashew::Ref_*,_std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>_>
                 ::operator*(&__end3);
        node_1.inst = pRVar3->inst;
        std::
        vector<(anonymous_namespace)::TraverseInfo,std::allocator<(anonymous_namespace)::TraverseInfo>>
        ::emplace_back<cashew::Ref&>
                  ((vector<(anonymous_namespace)::TraverseInfo,std::allocator<(anonymous_namespace)::TraverseInfo>>
                    *)local_38,&node_1);
        __gnu_cxx::
        __normal_iterator<cashew::Ref_*,_std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>_>::
        operator++(&__end3);
      }
    }
    else {
      __args.inst = (pvVar2->node).inst;
      std::
      vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ::pop_back((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                  *)local_38);
      std::function<void_(cashew::Ref)>::operator()(visitPost,__args);
    }
  }
  std::
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::~vector((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             *)local_38);
  return;
}

Assistant:

static void traversePrePost(Ref node,
                            std::function<void(Ref)> visitPre,
                            std::function<void(Ref)> visitPost) {
  std::vector<TraverseInfo> stack;
  stack.push_back(TraverseInfo(node));
  while (!stack.empty()) {
    TraverseInfo& back = stack.back();
    if (!back.scanned) {
      back.scanned = true;
      // This is the first time we see this.
      visitPre(back.node);
      for (auto child : back.children) {
        stack.emplace_back(child);
      }
      continue;
    }
    // Time to post-visit the node itself
    auto node = back.node;
    stack.pop_back();
    visitPost(node);
  }
}